

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

uint32_t FAudioFXReverb_IsOutputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pInputFormat,
                   FAudioWaveFormatEx *pRequestedOutputFormat,
                   FAudioWaveFormatEx **ppSupportedOutputFormat)

{
  int8_t iVar1;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  uint32_t result;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t uVar2;
  
  uVar2 = 0;
  if (((*(int *)(in_RSI + 4) != *(int *)(in_RDX + 4)) && (uVar2 = 1, in_RCX != (long *)0x0)) &&
     (*in_RCX != 0)) {
    *(undefined4 *)(*in_RCX + 4) = *(undefined4 *)(in_RSI + 4);
  }
  iVar1 = IsFloatFormat((FAudioWaveFormatEx *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  if (((iVar1 == '\0') && (uVar2 = 1, in_RCX != (long *)0x0)) && (*in_RCX != 0)) {
    *(undefined2 *)*in_RCX = 3;
  }
  if ((*(short *)(in_RSI + 2) == 1) || (*(short *)(in_RSI + 2) == 2)) {
    if ((*(short *)(in_RDX + 2) != *(short *)(in_RSI + 2)) &&
       (((*(short *)(in_RDX + 2) != 6 && (uVar2 = 1, in_RCX != (long *)0x0)) && (*in_RCX != 0)))) {
      *(undefined2 *)(*in_RCX + 2) = *(undefined2 *)(in_RSI + 2);
    }
  }
  else if (*(short *)(in_RSI + 2) == 6) {
    if (((*(short *)(in_RDX + 2) != 6) && (uVar2 = 1, in_RCX != (long *)0x0)) && (*in_RCX != 0)) {
      *(undefined2 *)(*in_RCX + 2) = *(undefined2 *)(in_RSI + 2);
    }
  }
  else {
    uVar2 = 1;
    if ((in_RCX != (long *)0x0) && (*in_RCX != 0)) {
      *(undefined2 *)(*in_RCX + 2) = 1;
    }
  }
  return uVar2;
}

Assistant:

uint32_t FAudioFXReverb_IsOutputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pInputFormat,
	const FAudioWaveFormatEx *pRequestedOutputFormat,
	FAudioWaveFormatEx **ppSupportedOutputFormat
) {
	uint32_t result = 0;

#define SET_SUPPORTED_FIELD(field, value)	\
	result = 1;	\
	if (ppSupportedOutputFormat && *ppSupportedOutputFormat)	\
	{	\
		(*ppSupportedOutputFormat)->field = (value);	\
	}

	/* Sample Rate */
	if (pInputFormat->nSamplesPerSec != pRequestedOutputFormat->nSamplesPerSec)
	{
		SET_SUPPORTED_FIELD(nSamplesPerSec, pInputFormat->nSamplesPerSec);
	}

	/* Data Type */
	if (!IsFloatFormat(pRequestedOutputFormat))
	{
		SET_SUPPORTED_FIELD(wFormatTag, FAUDIO_FORMAT_IEEE_FLOAT);
	}

	/* Input/Output Channel Count */
	if (pInputFormat->nChannels == 1 || pInputFormat->nChannels == 2)
	{
		if (	pRequestedOutputFormat->nChannels != pInputFormat->nChannels &&
			pRequestedOutputFormat->nChannels != 6)
		{
			SET_SUPPORTED_FIELD(nChannels, pInputFormat->nChannels);
		}
	}
	else if (pInputFormat->nChannels == 6)
	{
		if (pRequestedOutputFormat->nChannels != 6)
		{
			SET_SUPPORTED_FIELD(nChannels, pInputFormat->nChannels);
		}
	}
	else
	{
		SET_SUPPORTED_FIELD(nChannels, 1);
	}

#undef SET_SUPPORTED_FIELD

	return result;
}